

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O3

void __thiscall
netlist::NetlistPortDeclaration::~NetlistPortDeclaration(NetlistPortDeclaration *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer p;
  
  (this->super_NetlistNode).super_Node<netlist::NetlistNode,_netlist::NetlistEdge>._vptr_Node =
       (_func_int **)&PTR__NetlistPortDeclaration_0061acb0;
  p = (this->hierarchicalPath)._M_dataplus._M_p;
  paVar1 = &(this->hierarchicalPath).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)p != paVar1) {
    operator_delete(p,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_NetlistNode).super_Node<netlist::NetlistNode,_netlist::NetlistEdge>._vptr_Node =
       (_func_int **)&PTR__Node_0061ac90;
  std::
  vector<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>
  ::~vector(&(this->super_NetlistNode).super_Node<netlist::NetlistNode,_netlist::NetlistEdge>.edges)
  ;
  operator_delete(this,0x60);
  return;
}

Assistant:

NetlistPortDeclaration(const ast::Symbol& symbol) :
        NetlistNode(NodeKind::PortDeclaration, symbol) {}